

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall kratos::IRVisitor::visit_root(IRVisitor *this,IRNode *root)

{
  key_type pIVar1;
  IRNode *pIVar2;
  bool bVar3;
  IRNode *pIVar4;
  key_type pIVar5;
  _Node_iterator_base<kratos::IRNode_*,_false> local_38;
  _Node_iterator_base<kratos::IRNode_*,_false> local_30;
  key_type local_28;
  IRNode *child;
  uint64_t count;
  IRNode *root_local;
  IRVisitor *this_local;
  
  count = (uint64_t)root;
  root_local = (IRNode *)this;
  (**root->_vptr_IRNode)();
  this->level = this->level + 1;
  child = (IRNode *)0x0;
  while (pIVar2 = child, pIVar4 = (IRNode *)(**(code **)(*(long *)count + 8))(), pIVar2 < pIVar4) {
    local_28 = (key_type)(**(code **)(*(long *)count + 0x10))(count,child);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::find(&this->visited_,&local_28);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::IRNode_*,_std::hash<kratos::IRNode_*>,_std::equal_to<kratos::IRNode_*>,_std::allocator<kratos::IRNode_*>_>
         ::end(&this->visited_);
    bVar3 = std::__detail::operator==(&local_30,&local_38);
    if (bVar3) {
      std::
      unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
      ::emplace<kratos::IRNode*&>
                ((unordered_set<kratos::IRNode*,std::hash<kratos::IRNode*>,std::equal_to<kratos::IRNode*>,std::allocator<kratos::IRNode*>>
                  *)&this->visited_,&local_28);
      (**this->_vptr_IRVisitor)(this,local_28);
    }
    pIVar2 = child;
    pIVar4 = (IRNode *)(**(code **)(*(long *)count + 8))();
    pIVar1 = local_28;
    if ((pIVar2 < pIVar4) &&
       (pIVar5 = (key_type)(**(code **)(*(long *)count + 0x10))(count,child), pIVar1 == pIVar5)) {
      child = (IRNode *)((long)&child->_vptr_IRNode + 1);
    }
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void IRVisitor::visit_root(IRNode *root) {
    // recursively call visits
    root->accept(this);
    level++;
    uint64_t count = 0;
    while (count < root->child_count()) {
        auto *child = root->get_child(count);
        if (visited_.find(child) == visited_.end()) {
            visited_.emplace(child);
            visit_root(child);
        }
        if (count < root->child_count() && child == root->get_child(count)) {
            count++;
        }
    }
    level--;
}